

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen_Capture_Example.cpp
# Opt level: O0

vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *
getWindowToCapture(string *window_to_search_for)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  ostream *poVar6;
  ulong in_RSI;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *in_RDI;
  string name;
  Window *a;
  iterator __end1;
  iterator __begin1;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *__range1;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> windows;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *filtereditems;
  ostream *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  value_type *in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_a9 [33];
  reference local_88;
  Window *local_80;
  __normal_iterator<SL::Screen_Capture::Window_*,_std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_>
  local_78;
  undefined1 *local_70;
  undefined1 local_61;
  char *local_60;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_28 [40];
  
  SL::Screen_Capture::GetWindows();
  local_30 = std::__cxx11::string::begin();
  local_38 = std::__cxx11::string::end();
  local_40 = std::__cxx11::string::begin();
  local_60 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,getWindowToCapture(std::__cxx11::string)::__0>
                               (local_30,local_38,local_40);
  local_61 = 0;
  std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::vector
            ((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *)
             0x121fbf);
  local_70 = local_28;
  local_78._M_current =
       (Window *)
       std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::begin
                 ((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *
                  )in_stack_fffffffffffffeb8);
  local_80 = (Window *)
             std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::
             end((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *)
                 in_stack_fffffffffffffeb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<SL::Screen_Capture::Window_*,_std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<SL::Screen_Capture::Window_*,_std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_>
                             *)in_stack_fffffffffffffeb8), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<SL::Screen_Capture::Window_*,_std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_>
               ::operator*(&local_78);
    __s = local_88->Name;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,__s,(allocator<char> *)in_stack_fffffffffffffef0._M_current);
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    uVar2 = std::__cxx11::string::begin();
    uVar3 = std::__cxx11::string::end();
    uVar4 = std::__cxx11::string::begin();
    in_stack_fffffffffffffef0 =
         std::
         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,getWindowToCapture(std::__cxx11::string)::__1>
                   (uVar2,uVar3,uVar4);
    lVar5 = std::__cxx11::string::find((string *)(local_a9 + 1),in_RSI);
    if (lVar5 != -1) {
      std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::
      push_back((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *)
                in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      poVar6 = std::operator<<((ostream *)&std::cout,"ADDING WINDOW  Height ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(local_88->Size).y);
      in_stack_fffffffffffffed0 = std::operator<<(poVar6,"  Width  ");
      in_stack_fffffffffffffec8 =
           (value_type *)std::ostream::operator<<(in_stack_fffffffffffffed0,(local_88->Size).x);
      in_stack_fffffffffffffec0 = std::operator<<((ostream *)in_stack_fffffffffffffec8,"   ");
      in_stack_fffffffffffffeb8 = std::operator<<(in_stack_fffffffffffffec0,local_88->Name);
      std::ostream::operator<<(in_stack_fffffffffffffeb8,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    __gnu_cxx::
    __normal_iterator<SL::Screen_Capture::Window_*,_std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_>
    ::operator++(&local_78);
  }
  local_61 = 1;
  std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::~vector
            ((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *)
             in_stack_fffffffffffffed0);
  return in_RDI;
}

Assistant:

auto getWindowToCapture(std::string window_to_search_for = "blizzard")
{
    auto windows = SL::Screen_Capture::GetWindows(); 
    // convert to lower case for easier comparisons
    std::transform(window_to_search_for.begin(), window_to_search_for.end(), window_to_search_for.begin(),
                   [](char c) { return std::tolower(c, std::locale()); });
    decltype(windows) filtereditems;
    for (auto &a : windows) {
        std::string name = a.Name;
        std::transform(name.begin(), name.end(), name.begin(), [](char c) { return std::tolower(c, std::locale()); });
        if (name.find(window_to_search_for) != std::string::npos) {
            filtereditems.push_back(a);
            std::cout << "ADDING WINDOW  Height " << a.Size.y << "  Width  " << a.Size.x << "   " << a.Name << std::endl;
        }
    }

    return filtereditems;
}